

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  int iVar1;
  Rep *pRVar2;
  Tokenizer *pTVar3;
  Parser *this_00;
  RepeatedPtrFieldBase *this_01;
  bool bVar4;
  undefined8 in_RAX;
  DescriptorProto_ReservedRange *obj;
  void *pvVar5;
  char *error;
  int end;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_c4;
  Parser *local_c0;
  uint local_b8;
  int local_b4;
  LocationRecorder *local_b0;
  DescriptorProto *local_a8;
  LocationRecorder local_a0;
  RepeatedPtrFieldBase *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  local_88 = &(message->reserved_range_).super_RepeatedPtrFieldBase;
  local_b8 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_c0 = this;
  local_b0 = parent_location;
  local_a8 = message;
  do {
    this_01 = local_88;
    LocationRecorder::LocationRecorder
              (&local_48,local_b0,
               (local_a8->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    pRVar2 = (local_a8->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar2 == (Rep *)0x0) {
LAB_00345b9a:
      obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                      (this_01->arena_);
      pvVar5 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_01,obj);
    }
    else {
      iVar1 = (local_a8->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar2->allocated_size <= iVar1) goto LAB_00345b9a;
      (local_a8->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar5 = pRVar2->elements[iVar1];
    }
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    LocationRecorder::LocationRecorder(&local_a0,&local_48,1);
    this_00 = local_c0;
    pTVar3 = local_c0->input_;
    local_80._0_4_ = (pTVar3->current_).type;
    std::__cxx11::string::_M_assign((string *)&local_78);
    local_50 = (pTVar3->current_).end_column;
    local_58._0_4_ = (pTVar3->current_).line;
    local_58._4_4_ = (pTVar3->current_).column;
    error = "Expected field number range.";
    if ((local_b8 & 1) != 0) {
      error = "Expected field name or number range.";
    }
    bVar4 = ConsumeInteger(this_00,&local_b4,error);
    LocationRecorder::~LocationRecorder(&local_a0);
    if (bVar4) {
      bVar4 = TryConsume(local_c0,"to");
      if (bVar4) {
        LocationRecorder::LocationRecorder(&local_a0,&local_48,2);
        bVar4 = TryConsume(local_c0,"max");
        if (bVar4) {
          local_c4 = -2;
        }
        else {
          bVar4 = ConsumeInteger(local_c0,&local_c4,"Expected integer.");
          if (!bVar4) {
            LocationRecorder::~LocationRecorder(&local_a0);
            bVar4 = false;
            goto LAB_00345d25;
          }
        }
      }
      else {
        LocationRecorder::LocationRecorder(&local_a0,&local_48,2);
        LocationRecorder::StartAt(&local_a0,(Token *)local_80);
        LocationRecorder::EndAt(&local_a0,(Token *)local_80);
        local_c4 = local_b4;
      }
      LocationRecorder::~LocationRecorder(&local_a0);
      local_c4 = local_c4 + 1;
      *(int *)((long)pvVar5 + 0x18) = local_b4;
      *(uint *)((long)pvVar5 + 0x10) = *(uint *)((long)pvVar5 + 0x10) | 3;
      *(int *)((long)pvVar5 + 0x1c) = local_c4;
      bVar4 = true;
      local_b8 = 0;
    }
    else {
      bVar4 = false;
    }
LAB_00345d25:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    LocationRecorder::~LocationRecorder(&local_48);
    if (!bVar4) {
      return false;
    }
    bVar4 = TryConsume(local_c0,",");
    if (!bVar4) {
      bVar4 = ConsumeEndOfDeclaration(local_c0,";",local_b0);
      return bVar4;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}